

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O2

int Maj_ManAddCnfStart(Maj_Man_t *p)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  Vec_Int_t *pVVar4;
  long lVar5;
  int (*paaiVar6) [3] [32];
  int (*paaiVar7) [3] [32];
  int (*paiVar8) [32];
  long lVar9;
  long lVar10;
  int i;
  ulong uVar11;
  int (*local_108) [32];
  int pLits2 [2];
  long local_f8;
  int (*local_e0) [32];
  int pLits [32];
  
  lVar5 = (long)(p->nVars + 2);
  paaiVar6 = p->VarMarks + lVar5;
  paiVar8 = p->VarMarks[lVar5] + 1;
  i = 2;
  do {
    uVar3 = (ulong)p->nObjs;
    if ((long)uVar3 <= lVar5) {
      while( true ) {
        if (p->nObjs + -1 <= i) {
          return 1;
        }
        pVVar4 = Vec_WecEntry(p->vOutLits,i);
        if (pVVar4->nSize < 1) break;
        iVar2 = bmcg_sat_solver_addclause(p->pSat,pVVar4->pArray,pVVar4->nSize);
        i = i + 1;
        if (iVar2 == 0) {
          return 0;
        }
      }
      __assert_fail("Vec_IntSize(vArray) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                    ,0x134,"int Maj_ManAddCnfStart(Maj_Man_t *)");
    }
    local_f8 = 0;
    paaiVar7 = paaiVar6;
    local_e0 = paiVar8;
    while( true ) {
      uVar11 = 0;
      for (lVar9 = 0; iVar2 = (int)uVar11, lVar9 < (int)uVar3; lVar9 = lVar9 + 1) {
        iVar1 = (*paaiVar7)[0][lVar9];
        if (iVar1 != 0) {
          iVar1 = Abc_Var2Lit(iVar1,0);
          uVar11 = (ulong)(iVar2 + 1);
          pLits[iVar2] = iVar1;
          uVar3 = (ulong)(uint)p->nObjs;
        }
      }
      if (iVar2 < 1) {
        __assert_fail("nLits > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                      ,0x117,"int Maj_ManAddCnfStart(Maj_Man_t *)");
      }
      iVar1 = bmcg_sat_solver_addclause(p->pSat,pLits,iVar2);
      if (iVar1 == 0) {
        return 0;
      }
      lVar9 = 1;
      uVar3 = 0;
      while (uVar3 != uVar11) {
        lVar10 = lVar9;
        while ((int)lVar10 < iVar2) {
          pLits2[0] = Abc_LitNot(pLits[uVar3]);
          pLits2[1] = Abc_LitNot(pLits[lVar10]);
          iVar1 = bmcg_sat_solver_addclause(p->pSat,pLits2,2);
          lVar10 = lVar10 + 1;
          if (iVar1 == 0) {
            return 0;
          }
        }
        lVar9 = lVar9 + 1;
        uVar3 = uVar3 + 1;
      }
      if (local_f8 == 2) break;
      uVar3 = (ulong)(uint)p->nObjs;
      local_108 = local_e0;
      for (lVar9 = 0; lVar9 < (int)uVar3; lVar9 = lVar9 + 1) {
        if (p->VarMarks[lVar5][local_f8][lVar9] != 0) {
          for (lVar10 = 0; lVar9 + lVar10 < (long)(int)uVar3; lVar10 = lVar10 + 1) {
            if ((*local_108)[lVar10] != 0) {
              pLits2[0] = Abc_Var2Lit(p->VarMarks[lVar5][local_f8][lVar9],1);
              pLits2[1] = Abc_Var2Lit((*local_108)[lVar10],1);
              iVar2 = bmcg_sat_solver_addclause(p->pSat,pLits2,2);
              if (iVar2 == 0) {
                return 0;
              }
              uVar3 = (ulong)(uint)p->nObjs;
            }
          }
        }
        local_108 = (int (*) [32])(*local_108 + 1);
      }
      paaiVar7 = (int (*) [3] [32])(*paaiVar7 + 1);
      local_e0 = local_e0 + 1;
      local_f8 = local_f8 + 1;
    }
    lVar5 = lVar5 + 1;
    paaiVar6 = paaiVar6 + 1;
    paiVar8 = paiVar8 + 3;
  } while( true );
}

Assistant:

int Maj_ManAddCnfStart( Maj_Man_t * p )
{
    int pLits[MAJ_NOBJS], pLits2[2], i, j, k, n, m;
    // input constraints
    for ( i = p->nVars + 2; i < p->nObjs; i++ )
    {
        for ( k = 0; k < 3; k++ )
        {
            int nLits = 0;
            for ( j = 0; j < p->nObjs; j++ )
                if ( p->VarMarks[i][k][j] )
                    pLits[nLits++] = Abc_Var2Lit( p->VarMarks[i][k][j], 0 );
            assert( nLits > 0 );
            // input uniqueness
            if ( !bmcg_sat_solver_addclause( p->pSat, pLits, nLits ) )
                return 0;
            for ( n = 0;   n < nLits; n++ )
            for ( m = n+1; m < nLits; m++ )
            {
                pLits2[0] = Abc_LitNot(pLits[n]);
                pLits2[1] = Abc_LitNot(pLits[m]);
                if ( !bmcg_sat_solver_addclause( p->pSat, pLits2, 2 ) )
                    return 0;
            }
            if ( k == 2 )
                break;
            // symmetry breaking
            for ( j = 0; j < p->nObjs; j++ ) if ( p->VarMarks[i][k][j] )
            for ( n = j; n < p->nObjs; n++ ) if ( p->VarMarks[i][k+1][n] )
            {
                pLits2[0] = Abc_Var2Lit( p->VarMarks[i][k][j], 1 );
                pLits2[1] = Abc_Var2Lit( p->VarMarks[i][k+1][n], 1 );
                if ( !bmcg_sat_solver_addclause( p->pSat, pLits2, 2 ) )
                    return 0;
            }
        }
    }
    // outputs should be used
    for ( i = 2; i < p->nObjs - 1; i++ )
    {
        Vec_Int_t * vArray = Vec_WecEntry(p->vOutLits, i);
        assert( Vec_IntSize(vArray) > 0 );
        if ( !bmcg_sat_solver_addclause( p->pSat, Vec_IntArray(vArray), Vec_IntSize(vArray) ) )
            return 0;
    }
    return 1;
}